

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingBuffer.h
# Opt level: O2

uint __thiscall RingBuffer::ReadFromLittleEndian<unsigned_int>(RingBuffer *this)

{
  uchar *puVar1;
  undefined1 auVar2 [12];
  byte bVar3;
  undefined1 auVar4 [12];
  byte *pbVar5;
  long lVar6;
  uint uVar7;
  
  puVar1 = (this->data)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  pbVar5 = this->read;
  uVar7 = 0;
  for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
    bVar3 = (byte)lVar6 & 0x1f;
    uVar7 = uVar7 + ((uint)*pbVar5 << bVar3);
    auVar2._8_4_ = 0;
    auVar2._0_8_ = this->dataSize;
    auVar4._8_4_ = 0 << bVar3;
    auVar4._0_8_ = pbVar5 + (1 - (long)puVar1);
    pbVar5 = puVar1 + SUB128(auVar4 % auVar2,0);
    this->read = pbVar5;
  }
  return uVar7;
}

Assistant:

T ReadFromLittleEndian()
    {
        T result = 0;
        for (size_t i = 0; i < sizeof(T); ++i) {
            result += (((T)(*read)) << (8 * i));
            read = Increment(read, 1);
        }
        return result;
    }